

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model_property.cpp
# Opt level: O1

int __thiscall
lsim::StringProperty::clone
          (StringProperty *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  char *value;
  char *key;
  StringProperty *this_00;
  
  key = (char *)(**(code **)(*(long *)__fn + 0x10))(__fn);
  value = *(char **)(__fn + 0x28);
  this_00 = (StringProperty *)operator_new(0x48);
  StringProperty(this_00,key,value);
  (this->super_Property)._vptr_Property = (_func_int **)this_00;
  return (int)this;
}

Assistant:

Property::uptr_t StringProperty::clone() const {
    return make_property(key(), m_value.c_str());
}